

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall cfgfile::generator::cpp_generator_t::generate(cpp_generator_t *this,ostream *stream)

{
  pointer pbVar1;
  pointer pfVar2;
  pointer ppnVar3;
  pointer ppnVar4;
  pointer ppnVar5;
  pointer ppnVar6;
  field_type_t fVar7;
  string *psVar8;
  ostream *poVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  const_class_ptr_t this_00;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *pvVar12;
  field_t *f;
  field_t *f_00;
  field_t *f_01;
  field_t *f_02;
  string *incl;
  pointer pbVar13;
  pointer pfVar14;
  int iVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pointer ppnVar16;
  namespace_stack_t nms;
  namespace_stack_t tmp;
  const_namespace_ptr_t n;
  string guard;
  allocator local_189;
  ostream *local_188;
  allocator local_17a;
  allocator local_179;
  string local_178;
  const_class_ptr_t local_158;
  allocator local_149;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  _Vector_base<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
  local_108;
  string local_e8;
  _Vector_base<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
  local_c8;
  cpp_generator_t *local_a8;
  unsigned_long_long local_a0;
  namespace_t *local_98;
  allocator local_90 [32];
  allocator local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188 = stream;
  local_a8 = this;
  psVar8 = cfg::model_t::include_guard_abi_cxx11_(this->m_model);
  std::__cxx11::string::string((string *)&local_128,"__INCLUDED",(allocator *)&local_178);
  std::operator+(&local_50,psVar8,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_128,"\n#ifndef ",(allocator *)&local_e8);
  poVar9 = std::operator<<(local_188,(string *)&local_128);
  poVar9 = std::operator<<(poVar9,(string *)&local_50);
  std::__cxx11::string::string((string *)&local_178,"\n#define ",local_90);
  poVar9 = std::operator<<(poVar9,(string *)&local_178);
  poVar9 = std::operator<<(poVar9,(string *)&local_50);
  std::__cxx11::string::string(local_148,"\n\n",local_70);
  std::operator<<(poVar9,local_148);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_128);
  pvVar10 = cfg::model_t::global_includes_abi_cxx11_(local_a8->m_model);
  pvVar11 = cfg::model_t::relative_includes_abi_cxx11_(local_a8->m_model);
  std::operator<<(local_188,"// cfgfile include.\n#include <cfgfile/all.hpp>\n\n");
  poVar9 = std::operator<<(local_188,"// C++ include.\n");
  std::operator<<(poVar9,"#include <vector>\n\n");
  pbVar1 = (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
      pbVar13 = pbVar13 + 1) {
    poVar9 = std::operator<<(local_188,"#include <");
    poVar9 = std::operator<<(poVar9,(string *)pbVar13);
    std::operator<<(poVar9,">\n");
  }
  if ((pvVar10->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar10->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(local_188,"\n");
  }
  pbVar1 = (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
      pbVar13 = pbVar13 + 1) {
    poVar9 = std::operator<<(local_188,"#include \"");
    poVar9 = std::operator<<(poVar9,(string *)pbVar13);
    std::operator<<(poVar9,"\"\n");
  }
  if ((pvVar11->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar11->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(local_188,"\n");
  }
  local_a0 = 0;
  do {
    this_00 = cfg::model_t::next_class(local_a8->m_model,local_a0);
    if (this_00 == (const_class_ptr_t)0x0) {
      while (local_108._M_impl.super__Vector_impl_data._M_start !=
             local_108._M_impl.super__Vector_impl_data._M_finish) {
        close_namespace(local_188,(namespace_stack_t *)&local_108);
      }
      std::__cxx11::string::string((string *)&local_128,"#endif // ",(allocator *)local_148);
      poVar9 = std::operator<<(local_188,(string *)&local_128);
      poVar9 = std::operator<<(poVar9,(string *)&local_50);
      std::__cxx11::string::string((string *)&local_178,"\n",(allocator *)&local_e8);
      std::operator<<(poVar9,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_50);
      std::
      _Vector_base<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
      ::~_Vector_base(&local_108);
      return;
    }
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158 = this_00;
    local_98 = cfg::class_t::parent_namespace(this_00);
    local_a0 = local_a0 + 1;
    for (; local_98 != (namespace_t *)0x0; local_98 = cfg::namespace_t::parent_namespace(local_98))
    {
      psVar8 = cfg::namespace_t::name_abi_cxx11_(local_98);
      if (psVar8->_M_string_length != 0) {
        std::
        vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
        ::push_back((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                     *)&local_c8,&local_98);
      }
    }
    if (local_c8._M_impl.super__Vector_impl_data._M_start ==
        local_c8._M_impl.super__Vector_impl_data._M_finish) {
      while (local_108._M_impl.super__Vector_impl_data._M_start !=
             local_108._M_impl.super__Vector_impl_data._M_finish) {
        close_namespace(local_188,(namespace_stack_t *)&local_108);
      }
    }
    else {
      std::
      __reverse<__gnu_cxx::__normal_iterator<cfgfile::generator::cfg::namespace_t_const**,std::vector<cfgfile::generator::cfg::namespace_t_const*,std::allocator<cfgfile::generator::cfg::namespace_t_const*>>>>
                ();
      while( true ) {
        ppnVar6 = local_c8._M_impl.super__Vector_impl_data._M_finish;
        ppnVar16 = local_c8._M_impl.super__Vector_impl_data._M_start;
        ppnVar5 = local_108._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppnVar4 = local_108._M_impl.super__Vector_impl_data._M_finish;
        ppnVar3 = local_108._M_impl.super__Vector_impl_data._M_start;
        if (local_108._M_impl.super__Vector_impl_data._M_start ==
            local_108._M_impl.super__Vector_impl_data._M_finish) break;
        if (local_108._M_impl.super__Vector_impl_data._M_finish[-1] ==
            local_c8._M_impl.super__Vector_impl_data._M_finish[-1]) goto LAB_001119f3;
        close_namespace(local_188,(namespace_stack_t *)&local_108);
      }
      local_108._M_impl.super__Vector_impl_data._M_start =
           local_c8._M_impl.super__Vector_impl_data._M_start;
      local_108._M_impl.super__Vector_impl_data._M_finish =
           local_c8._M_impl.super__Vector_impl_data._M_finish;
      local_108._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_c8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8._M_impl.super__Vector_impl_data._M_start = ppnVar3;
      local_c8._M_impl.super__Vector_impl_data._M_finish = ppnVar4;
      local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = ppnVar5;
      for (; ppnVar16 != ppnVar6; ppnVar16 = ppnVar16 + 1) {
        poVar9 = std::operator<<(local_188,"namespace ");
        psVar8 = cfg::namespace_t::name_abi_cxx11_(*ppnVar16);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::operator<<(poVar9," {\n\n");
      }
    }
LAB_001119f3:
    std::__cxx11::string::string((string *)&local_128,"//\n// ",(allocator *)local_148);
    poVar9 = std::operator<<(local_188,(string *)&local_128);
    psVar8 = cfg::class_t::name_abi_cxx11_(local_158);
    poVar9 = std::operator<<(poVar9,(string *)psVar8);
    std::__cxx11::string::string((string *)&local_178,"\n//\n\n",(allocator *)&local_e8);
    std::operator<<(poVar9,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"class ",(allocator *)local_148);
    poVar9 = std::operator<<(local_188,(string *)&local_128);
    psVar8 = cfg::class_t::name_abi_cxx11_(local_158);
    poVar9 = std::operator<<(poVar9,(string *)psVar8);
    std::__cxx11::string::string((string *)&local_178," {\n",(allocator *)&local_e8);
    std::operator<<(poVar9,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"public:\n",(allocator *)&local_178);
    std::operator<<(local_188,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"\t",(allocator *)local_148);
    poVar9 = std::operator<<(local_188,(string *)&local_128);
    psVar8 = cfg::class_t::name_abi_cxx11_(local_158);
    poVar9 = std::operator<<(poVar9,(string *)psVar8);
    std::__cxx11::string::string((string *)&local_178,"()\n",(allocator *)&local_e8);
    std::operator<<(poVar9,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    pvVar12 = cfg::class_t::fields(local_158);
    pfVar2 = (pvVar12->
             super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    iVar15 = 0;
    for (pfVar14 = (pvVar12->
                   super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
                   )._M_impl.super__Vector_impl_data._M_start; pfVar14 != pfVar2;
        pfVar14 = pfVar14 + 1) {
      psVar8 = cfg::field_t::default_value_abi_cxx11_(pfVar14);
      if (psVar8->_M_string_length != 0) {
        if (iVar15 == 0) {
          std::__cxx11::string::string((string *)&local_128,"\t\t:",(allocator *)&local_178);
          std::operator<<(local_188,(string *)&local_128);
        }
        else {
          std::__cxx11::string::string((string *)&local_128,"\t\t,",(allocator *)&local_178);
          std::operator<<(local_188,(string *)&local_128);
        }
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::string((string *)&local_128,"\tm_",(allocator *)&local_e8);
        poVar9 = std::operator<<(local_188,(string *)&local_128);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)&local_178,"( ",local_90);
        poVar9 = std::operator<<(poVar9,(string *)&local_178);
        psVar8 = cfg::field_t::default_value_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string(local_148," )\n",local_70);
        std::operator<<(poVar9,local_148);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_128);
        iVar15 = iVar15 + 1;
      }
    }
    std::__cxx11::string::string((string *)&local_128,"\t{\n\t}\n\t~",(allocator *)local_148);
    poVar9 = std::operator<<(local_188,(string *)&local_128);
    psVar8 = cfg::class_t::name_abi_cxx11_(local_158);
    poVar9 = std::operator<<(poVar9,(string *)psVar8);
    std::__cxx11::string::string((string *)&local_178,"()\n\t{\n\t}\n\n",(allocator *)&local_e8);
    std::operator<<(poVar9,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    pvVar12 = cfg::class_t::fields(local_158);
    pfVar2 = (pvVar12->
             super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pfVar14 = (pvVar12->
                   super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
                   )._M_impl.super__Vector_impl_data._M_start; pfVar14 != pfVar2;
        pfVar14 = pfVar14 + 1) {
      fVar7 = cfg::field_t::type(pfVar14);
      if (fVar7 == no_value_field_type) {
        std::__cxx11::string::string((string *)&local_128,"\tbool ",(allocator *)&local_e8);
        poVar9 = std::operator<<(local_188,(string *)&local_128);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)&local_178,"() const\n\t{\n\t\treturn m_",local_90);
        poVar9 = std::operator<<(poVar9,(string *)&local_178);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string(local_148,";\n\t}\n",local_70);
        std::operator<<(poVar9,local_148);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::string((string *)&local_128,"\tvoid ",local_90);
        poVar9 = std::operator<<(local_188,(string *)&local_128);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        generate_setter_method_name(&local_178,psVar8);
        poVar9 = std::operator<<(poVar9,(string *)&local_178);
        std::__cxx11::string::string(local_148,"( bool v = true )\n\t{\n\t\tm_",local_70);
        poVar9 = std::operator<<(poVar9,local_148);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)&local_e8," = v;\n\t}\n\n",&local_189);
        std::operator<<(poVar9,(string *)&local_e8);
      }
      else {
        std::__cxx11::string::string((string *)&local_128,"\tconst ",local_70);
        poVar9 = std::operator<<(local_188,(string *)&local_128);
        generate_type_of_data_abi_cxx11_(&local_178,(generator *)pfVar14,f);
        poVar9 = std::operator<<(poVar9,(string *)&local_178);
        std::__cxx11::string::string(local_148," & ",&local_189);
        poVar9 = std::operator<<(poVar9,local_148);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)&local_e8,"() const\n\t{\n\t\treturn m_",&local_179);
        poVar9 = std::operator<<(poVar9,(string *)&local_e8);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)local_90,";\n\t}\n",&local_17a);
        std::operator<<(poVar9,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::string((string *)&local_128,"\t",local_70);
        poVar9 = std::operator<<(local_188,(string *)&local_128);
        generate_type_of_data_abi_cxx11_(&local_178,(generator *)pfVar14,f_00);
        poVar9 = std::operator<<(poVar9,(string *)&local_178);
        std::__cxx11::string::string(local_148," & ",&local_189);
        poVar9 = std::operator<<(poVar9,local_148);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)&local_e8,"()\n\t{\n\t\treturn m_",&local_179);
        poVar9 = std::operator<<(poVar9,(string *)&local_e8);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)local_90,";\n\t}\n",&local_17a);
        std::operator<<(poVar9,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::string((string *)&local_128,"\tvoid ",&local_189);
        poVar9 = std::operator<<(local_188,(string *)&local_128);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        generate_setter_method_name(&local_178,psVar8);
        poVar9 = std::operator<<(poVar9,(string *)&local_178);
        std::__cxx11::string::string(local_148,"( const ",&local_179);
        poVar9 = std::operator<<(poVar9,local_148);
        generate_type_of_data_abi_cxx11_(&local_e8,(generator *)pfVar14,f_01);
        poVar9 = std::operator<<(poVar9,(string *)&local_e8);
        std::__cxx11::string::string((string *)local_90," & v )\n\t{\n\t\tm_",&local_17a);
        poVar9 = std::operator<<(poVar9,(string *)local_90);
        psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::string::string((string *)local_70," = v;\n\t}\n\n",&local_149);
        std::operator<<(poVar9,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string((string *)local_90);
      }
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::string((string *)&local_128,"private:\n",(allocator *)&local_178);
    std::operator<<(local_188,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    pvVar12 = cfg::class_t::fields(local_158);
    pfVar2 = (pvVar12->
             super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pfVar14 = (pvVar12->
                   super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
                   )._M_impl.super__Vector_impl_data._M_start; pfVar14 != pfVar2;
        pfVar14 = pfVar14 + 1) {
      std::__cxx11::string::string((string *)&local_128,"\t",local_90);
      poVar9 = std::operator<<(local_188,(string *)&local_128);
      generate_type_of_data_abi_cxx11_(&local_178,(generator *)pfVar14,f_02);
      poVar9 = std::operator<<(poVar9,(string *)&local_178);
      std::__cxx11::string::string(local_148," m_",local_70);
      poVar9 = std::operator<<(poVar9,local_148);
      psVar8 = cfg::field_t::name_abi_cxx11_(pfVar14);
      poVar9 = std::operator<<(poVar9,(string *)psVar8);
      std::__cxx11::string::string((string *)&local_e8,";\n",&local_189);
      std::operator<<(poVar9,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::string((string *)&local_128,"}; // class ",(allocator *)local_148);
    poVar9 = std::operator<<(local_188,(string *)&local_128);
    psVar8 = cfg::class_t::name_abi_cxx11_(local_158);
    poVar9 = std::operator<<(poVar9,(string *)psVar8);
    std::__cxx11::string::string((string *)&local_178,"\n\n\n",(allocator *)&local_e8);
    std::operator<<(poVar9,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    generate_tag_class(local_188,local_158);
    std::
    _Vector_base<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
    ::~_Vector_base(&local_c8);
  } while( true );
}

Assistant:

void
cpp_generator_t::generate( std::ostream & stream ) const
{
	unsigned long long index = 0;

	namespace_stack_t nms;

	cfg::const_class_ptr_t c = 0;

	const std::string guard = m_model.include_guard() +
		std::string( "__INCLUDED" );

	stream << std::string( "\n#ifndef " ) << guard
		<< std::string( "\n#define " ) << guard
		<< std::string( "\n\n" );

	generate_includes( stream, m_model.global_includes(),
		m_model.relative_includes() );

	while( ( c = m_model.next_class( index ) ) )
	{
		++index;

		namespace_stack_t tmp;

		const_namespace_ptr_t n = c->parent_namespace();

		while( n )
		{
			if( !n->name().empty() )
				tmp.push_back( n );

			n = n->parent_namespace();
		}

		if( !tmp.empty() )
		{
			std::reverse( tmp.begin(), tmp.end() );

			while( !nms.empty() && nms.back() != tmp.back() )
				close_namespace( stream, nms );

			if( nms.empty() )
			{
				nms.swap( tmp );

				start_namespaces( stream, nms );
			}
		}
		else
		{
			while( !nms.empty() )
				close_namespace( stream, nms );
		}

		generate_cpp_classes( stream, c );
	}

	while( !nms.empty() )
		close_namespace( stream, nms );

	stream << std::string( "#endif // " ) << guard
		<< std::string( "\n" );
}